

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

ssize_t __thiscall
trial::protocol::buffer::vector<unsigned_char,_std::allocator<unsigned_char>_>::write
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *this,int __fd,void *__buf,
          size_t __n)

{
  int iVar1;
  undefined4 extraout_var;
  iterator iVar2;
  undefined4 in_register_00000034;
  long *plVar3;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,__fd);
  iVar1 = (*(this->super_base<unsigned_char>)._vptr_base[2])(this,*plVar3);
  if ((char)iVar1 != '\0') {
    iVar2 = std::vector<unsigned_char,std::allocator<unsigned_char>>::
            insert<unsigned_char_const*,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)this->buffer,
                       *(uchar **)
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)this->buffer + 8),
                       (uchar *)plVar3[1],(uchar *)plVar3[1] + *plVar3);
    return (ssize_t)iVar2._M_current;
  }
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

virtual void write(const view_type& view)
    {
        if (grow(view.size()))
        {
            buffer.insert(buffer.end(), view.begin(), view.end());
        }
    }